

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SPIRType * __thiscall spirv_cross::Compiler::get_type_from_variable(Compiler *this,VariableID id)

{
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  
  pSVar1 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id.id);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar1->super_IVariant).field_0xc);
  return pSVar2;
}

Assistant:

const SPIRType &Compiler::get_type_from_variable(VariableID id) const
{
	return get<SPIRType>(get<SPIRVariable>(id).basetype);
}